

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.hpp
# Opt level: O0

vector<Item,_std::allocator<Item>_> *
getContent(vector<Item,_std::allocator<Item>_> *__return_storage_ptr__,Item *item)

{
  code *pcVar1;
  bool bVar2;
  reference pIVar3;
  reference pIVar4;
  undefined1 local_2f8 [8];
  Item i_3;
  iterator __end2_3;
  iterator __begin2_3;
  set<Item,_std::less<Item>,_std::allocator<Item>_> *__range2_3;
  undefined1 local_268 [8];
  set<Item,_std::less<Item>,_std::allocator<Item>_> s_1;
  Item i_2;
  iterator __end2_2;
  iterator __begin2_2;
  set<Item,_std::less<Item>,_std::allocator<Item>_> *__range2_2;
  undefined1 local_1a8 [8];
  set<Item,_std::less<Item>,_std::allocator<Item>_> s;
  Item i_1;
  iterator __end2_1;
  iterator __begin2_1;
  list<Item,_std::allocator<Item>_> *__range2_1;
  undefined1 local_e8 [8];
  list<Item,_std::allocator<Item>_> l_1;
  undefined1 local_c0 [8];
  Item i;
  iterator __end2;
  iterator __begin2;
  list<Item,_std::allocator<Item>_> *__range2;
  undefined1 local_30 [8];
  list<Item,_std::allocator<Item>_> l;
  Item *item_local;
  vector<Item,_std::allocator<Item>_> *ret;
  
  l.super__List_base<Item,_std::allocator<Item>_>._M_impl._M_node._M_size = (size_t)item;
  bVar2 = std::operator==(&item->type,"Array");
  if (bVar2) {
    std::vector<Item,_std::allocator<Item>_>::vector
              (__return_storage_ptr__,
               (vector<Item,_std::allocator<Item>_> *)((long)item->value + 0x38));
  }
  else {
    bVar2 = std::operator==(&item->type,"MutableArray");
    if (bVar2) {
      std::vector<Item,_std::allocator<Item>_>::vector
                (__return_storage_ptr__,
                 (vector<Item,_std::allocator<Item>_> *)((long)item->value + 0x38));
    }
    else {
      bVar2 = std::operator==(&item->type,"ArrayList");
      if (bVar2) {
        std::vector<Item,_std::allocator<Item>_>::vector
                  (__return_storage_ptr__,
                   (vector<Item,_std::allocator<Item>_> *)((long)item->value + 0x58));
      }
      else {
        bVar2 = std::operator==(&item->type,"MutableArrayList");
        if (bVar2) {
          std::vector<Item,_std::allocator<Item>_>::vector
                    (__return_storage_ptr__,
                     (vector<Item,_std::allocator<Item>_> *)((long)item->value + 0x58));
        }
        else {
          bVar2 = std::operator==(&item->type,"List");
          if (bVar2) {
            std::__cxx11::list<Item,_std::allocator<Item>_>::list
                      ((list<Item,_std::allocator<Item>_> *)local_30,
                       (list<Item,_std::allocator<Item>_> *)((long)item->value + 0x38));
            std::vector<Item,_std::allocator<Item>_>::vector(__return_storage_ptr__);
            __end2 = std::__cxx11::list<Item,_std::allocator<Item>_>::begin
                               ((list<Item,_std::allocator<Item>_> *)local_30);
            i.type.field_2._8_8_ =
                 std::__cxx11::list<Item,_std::allocator<Item>_>::end
                           ((list<Item,_std::allocator<Item>_> *)local_30);
            while (bVar2 = std::operator==(&__end2,(_Self *)((long)&i.type.field_2 + 8)),
                  ((bVar2 ^ 0xffU) & 1) != 0) {
              pIVar3 = std::_List_iterator<Item>::operator*(&__end2);
              Item::Item((Item *)local_c0,pIVar3);
              std::vector<Item,_std::allocator<Item>_>::push_back
                        (__return_storage_ptr__,(value_type *)local_c0);
              Item::~Item((Item *)local_c0);
              std::_List_iterator<Item>::operator++(&__end2);
            }
            std::__cxx11::list<Item,_std::allocator<Item>_>::~list
                      ((list<Item,_std::allocator<Item>_> *)local_30);
          }
          else {
            bVar2 = std::operator==(&item->type,"MutableList");
            if (bVar2) {
              std::__cxx11::list<Item,_std::allocator<Item>_>::list
                        ((list<Item,_std::allocator<Item>_> *)local_e8,
                         (list<Item,_std::allocator<Item>_> *)((long)item->value + 0x58));
              std::vector<Item,_std::allocator<Item>_>::vector(__return_storage_ptr__);
              __end2_1 = std::__cxx11::list<Item,_std::allocator<Item>_>::begin
                                   ((list<Item,_std::allocator<Item>_> *)local_e8);
              i_1.type.field_2._8_8_ =
                   std::__cxx11::list<Item,_std::allocator<Item>_>::end
                             ((list<Item,_std::allocator<Item>_> *)local_e8);
              while (bVar2 = std::operator==(&__end2_1,(_Self *)((long)&i_1.type.field_2 + 8)),
                    ((bVar2 ^ 0xffU) & 1) != 0) {
                pIVar3 = std::_List_iterator<Item>::operator*(&__end2_1);
                Item::Item((Item *)&s._M_t._M_impl.super__Rb_tree_header._M_node_count,pIVar3);
                std::vector<Item,_std::allocator<Item>_>::push_back
                          (__return_storage_ptr__,
                           (value_type *)&s._M_t._M_impl.super__Rb_tree_header._M_node_count);
                Item::~Item((Item *)&s._M_t._M_impl.super__Rb_tree_header._M_node_count);
                std::_List_iterator<Item>::operator++(&__end2_1);
              }
              std::__cxx11::list<Item,_std::allocator<Item>_>::~list
                        ((list<Item,_std::allocator<Item>_> *)local_e8);
            }
            else {
              bVar2 = std::operator==(&item->type,"Set");
              if (bVar2) {
                std::set<Item,_std::less<Item>,_std::allocator<Item>_>::set
                          ((set<Item,_std::less<Item>,_std::allocator<Item>_> *)local_1a8,
                           (set<Item,_std::less<Item>,_std::allocator<Item>_> *)
                           ((long)item->value + 0x38));
                std::vector<Item,_std::allocator<Item>_>::vector(__return_storage_ptr__);
                __end2_2 = std::set<Item,_std::less<Item>,_std::allocator<Item>_>::begin
                                     ((set<Item,_std::less<Item>,_std::allocator<Item>_> *)local_1a8
                                     );
                i_2.type.field_2._8_8_ =
                     std::set<Item,_std::less<Item>,_std::allocator<Item>_>::end
                               ((set<Item,_std::less<Item>,_std::allocator<Item>_> *)local_1a8);
                while (bVar2 = std::operator==(&__end2_2,(_Self *)((long)&i_2.type.field_2 + 8)),
                      ((bVar2 ^ 0xffU) & 1) != 0) {
                  pIVar4 = std::_Rb_tree_const_iterator<Item>::operator*(&__end2_2);
                  Item::Item((Item *)&s_1._M_t._M_impl.super__Rb_tree_header._M_node_count,pIVar4);
                  std::vector<Item,_std::allocator<Item>_>::push_back
                            (__return_storage_ptr__,
                             (value_type *)&s_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
                  Item::~Item((Item *)&s_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
                  std::_Rb_tree_const_iterator<Item>::operator++(&__end2_2);
                }
                std::set<Item,_std::less<Item>,_std::allocator<Item>_>::~set
                          ((set<Item,_std::less<Item>,_std::allocator<Item>_> *)local_1a8);
              }
              else {
                bVar2 = std::operator==(&item->type,"MutableSet");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                std::set<Item,_std::less<Item>,_std::allocator<Item>_>::set
                          ((set<Item,_std::less<Item>,_std::allocator<Item>_> *)local_268,
                           (set<Item,_std::less<Item>,_std::allocator<Item>_> *)
                           ((long)item->value + 0x70));
                std::vector<Item,_std::allocator<Item>_>::vector(__return_storage_ptr__);
                __end2_3 = std::set<Item,_std::less<Item>,_std::allocator<Item>_>::begin
                                     ((set<Item,_std::less<Item>,_std::allocator<Item>_> *)local_268
                                     );
                i_3.type.field_2._8_8_ =
                     std::set<Item,_std::less<Item>,_std::allocator<Item>_>::end
                               ((set<Item,_std::less<Item>,_std::allocator<Item>_> *)local_268);
                while (bVar2 = std::operator==(&__end2_3,(_Self *)((long)&i_3.type.field_2 + 8)),
                      ((bVar2 ^ 0xffU) & 1) != 0) {
                  pIVar4 = std::_Rb_tree_const_iterator<Item>::operator*(&__end2_3);
                  Item::Item((Item *)local_2f8,pIVar4);
                  std::vector<Item,_std::allocator<Item>_>::push_back
                            (__return_storage_ptr__,(value_type *)local_2f8);
                  Item::~Item((Item *)local_2f8);
                  std::_Rb_tree_const_iterator<Item>::operator++(&__end2_3);
                }
                std::set<Item,_std::less<Item>,_std::allocator<Item>_>::~set
                          ((set<Item,_std::less<Item>,_std::allocator<Item>_> *)local_268);
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Item> getContent(Item item) {
	if (item.type == "Array") {
		return static_cast<Array *>(item.value)->content;
	}
	if (item.type == "MutableArray") {
		return static_cast<MutableArray *>(item.value)->content;
	}
	if (item.type == "ArrayList") {
		return static_cast<ArrayList *>(item.value)->content;
	}
	if (item.type == "MutableArrayList") {
		return static_cast<MutableArrayList *>(item.value)->content;
	}
	if (item.type == "List") {
		list<Item> l = static_cast<List *>(item.value)->content;
		vector<Item> ret;
		for (Item i : l) {
			ret.push_back(i);
		}
		return ret;
	}
	if (item.type == "MutableList") {
		list<Item> l = static_cast<MutableList *>(item.value)->content;
		vector<Item> ret;
		for (Item i : l) {
			ret.push_back(i);
		}
		return ret;
	}
	if (item.type == "Set") {
		set<Item> s = static_cast<Set *>(item.value)->content;
		vector<Item> ret;
		for (Item i : s) {
			ret.push_back(i);
		}
		return ret;
	}
	if (item.type == "MutableSet") {
		set<Item> s = static_cast<MutableSet *>(item.value)->content;
		vector<Item> ret;
		for (Item i : s) {
			ret.push_back(i);
		}
		return ret;
	}
}